

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_dynamic_content.cpp
# Opt level: O3

void __thiscall
ServeDynamicContent_Version_Test::~ServeDynamicContent_Version_Test
          (ServeDynamicContent_Version_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ServeDynamicContent, Version) {
    std::string output;
    auto sender = [&output] (int io, pstore::gsl::span<std::uint8_t const> const & s) {
        std::transform (std::begin (s), std::end (s), std::back_inserter (output),
                        [] (std::uint8_t v) { return static_cast<char> (v); });
        return pstore::error_or<int>{io};
    };

    pstore::error_or<int> const r = pstore::http::serve_dynamic_content (
        sender, 0, std::string{pstore::http::dynamic_path} + "version");
    EXPECT_TRUE (r);
    EXPECT_THAT (output, ::testing::ContainsRegex ("\r\n\r\n\\{ *\"version\" *:"));
}